

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O3

int __thiscall FWadFileLump::FillCache(FWadFileLump *this)

{
  FileReader *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  SBYTE SVar4;
  ulong uVar5;
  FileReaderLZSS lzss;
  FileReaderLZSS local_20d8;
  
  if ((this->super_FResourceLump).field_0x4c == '\0') {
    iVar2 = (*(((this->super_FResourceLump).Owner)->Reader->super_FileReaderBase).
              _vptr_FileReaderBase[6])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      (this->super_FResourceLump).Cache =
           (char *)(CONCAT44(extraout_var,iVar2) + (long)this->Position);
      iVar2 = -1;
      SVar4 = -1;
      goto LAB_006331da;
    }
  }
  pFVar1 = ((this->super_FResourceLump).Owner)->Reader;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(long)this->Position,0);
  uVar5 = (ulong)(this->super_FResourceLump).LumpSize;
  pcVar3 = (char *)operator_new__(uVar5);
  (this->super_FResourceLump).Cache = pcVar3;
  if ((this->super_FResourceLump).field_0x4c == '\x01') {
    local_20d8.File = ((this->super_FResourceLump).Owner)->Reader;
    local_20d8.Stream.WindowData = local_20d8.Stream.Window + 0x1000;
    local_20d8.super_FileReaderBase._vptr_FileReaderBase =
         (_func_int **)&PTR__FileReaderBase_0088bb78;
    local_20d8.SawEOF = false;
    local_20d8.Stream.State = STREAM_EMPTY;
    local_20d8.Stream.AvailIn = 0;
    local_20d8.Stream.InternalOut = 0;
    local_20d8.Stream.InternalBuffer = local_20d8.Stream.WindowData;
    FileReaderLZSS::FillBuffer(&local_20d8);
    FileReaderLZSS::Read
              (&local_20d8,(this->super_FResourceLump).Cache,
               (long)(this->super_FResourceLump).LumpSize);
  }
  else {
    pFVar1 = ((this->super_FResourceLump).Owner)->Reader;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,pcVar3,uVar5);
  }
  iVar2 = 1;
  SVar4 = '\x01';
LAB_006331da:
  (this->super_FResourceLump).RefCount = SVar4;
  return iVar2;
}

Assistant:

int FillCache()
	{
		if(!Compressed)
		{
			const char * buffer = Owner->Reader->GetBuffer();

			if (buffer != NULL)
			{
				// This is an in-memory file so the cache can point directly to the file's data.
				Cache = const_cast<char*>(buffer) + Position;
				RefCount = -1;
				return -1;
			}
		}

		Owner->Reader->Seek(Position, SEEK_SET);
		Cache = new char[LumpSize];

		if(Compressed)
		{
			FileReaderLZSS lzss(*Owner->Reader);
			lzss.Read(Cache, LumpSize);
		}
		else
			Owner->Reader->Read(Cache, LumpSize);

		RefCount = 1;
		return 1;
	}